

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O3

int Gia_ManFindChainStart(Gia_Man_t *p)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  
  if ((long)p->nObjs < 1) {
    return -1;
  }
  uVar3 = 0;
  iVar5 = 0;
  uVar2 = 0xffffffff;
  pGVar4 = p->pObjs;
  do {
    if (p->pObjs == (Gia_Obj_t *)0x0) {
      return -1;
    }
    if (((*(ulong *)pGVar4 & 0xc0000000c0000000) == 0 && (~(uint)*(ulong *)pGVar4 & 0x1fffffff) != 0
        ) && (iVar1 = p->vLevels->pArray[uVar3], iVar5 <= iVar1)) {
      uVar2 = uVar3 & 0xffffffff;
      iVar5 = iVar1;
    }
    uVar3 = uVar3 + 1;
    pGVar4 = pGVar4 + 1;
  } while ((long)p->nObjs != uVar3);
  return (int)uVar2;
}

Assistant:

int Gia_ManFindChainStart( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int * pDelays = Vec_IntArray(p->vLevels);
    int i, iMax = -1, DelayMax = 0;
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( Gia_ObjIsUsed(pObj) )
            continue;
        if ( DelayMax > pDelays[i] )
            continue;
        DelayMax = pDelays[i];
        iMax = i;
    }
    return iMax;
}